

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O1

int project_tube(float *f,int *i,int c)

{
  float fVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  
  if (0 < c) {
    iVar2 = c + 2;
    lVar3 = 0;
    do {
      fVar1 = *(float *)((long)f + lVar3) * 3.1415927;
      fVar8 = view_right - view_left;
      if (view_bottom - view_top <= view_right - view_left) {
        fVar8 = view_bottom - view_top;
      }
      dVar4 = (double)(fVar1 + fVar1 + 1.5707964);
      dVar5 = cos(dVar4);
      dVar4 = sin(dVar4);
      fVar1 = (1.0 - *(float *)((long)f + lVar3 + 4)) * 8.0 + 1.0;
      auVar6._0_4_ = (float)dVar5;
      auVar6._4_4_ = (float)dVar4;
      auVar6._8_8_ = 0;
      auVar7._4_4_ = fVar1;
      auVar7._0_4_ = fVar1;
      auVar7._8_4_ = fVar1;
      auVar7._12_4_ = fVar1;
      auVar7 = divps(auVar6,auVar7);
      *(ulong *)((long)i + lVar3) =
           CONCAT44((int)((view_bottom + view_top) * 0.5 + fVar8 * 0.5 * auVar7._4_4_),
                    (int)((view_right + view_left) * 0.5 + fVar8 * 0.5 * auVar7._0_4_));
      lVar3 = lVar3 + 8;
      iVar2 = iVar2 + -2;
    } while (2 < iVar2);
  }
  return -1;
}

Assistant:

static int project_tube(float *f, int *i, int c)
{
   while (c > 0) {
      float ang = f[0] * M_PI * 2.0 + M_PI / 2.0;

      float xsize = view_right - view_left;
      float ysize = view_bottom - view_top;
      float size = MIN(xsize, ysize) / 2.0;

      float x = cos(ang);
      float y = sin(ang);

      float z = 1.0 + (1.0 - f[1]) * 8.0;

      i[0] = x/z * size + (view_left + view_right) / 2.0;
      i[1] = y/z * size + (view_top + view_bottom) / 2.0;

      f += 2;
      i += 2;
      c -= 2;
   }

   return TRUE;
}